

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chimp_fetch.hpp
# Opt level: O0

void duckdb::ChimpFetchRow<float>
               (ColumnSegment *segment,ColumnFetchState *state,row_t row_id,Vector *result,
               idx_t result_idx)

{
  bool bVar1;
  ChimpGroupState<unsigned_int> *this;
  ChimpScanState<float> *this_00;
  long in_RDX;
  uint *in_RDI;
  uint *result_data;
  ChimpScanState<float> scan_state;
  element_type *in_stack_fffffffffffed748;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffed750;
  ulong uStack_12898;
  ColumnSegment *in_stack_fffffffffffed7b8;
  ChimpScanState<float> *in_stack_fffffffffffed7c0;
  idx_t in_stack_fffffffffffee720;
  ColumnSegment *in_stack_fffffffffffee728;
  ChimpScanState<float> *in_stack_fffffffffffee730;
  ulong local_30;
  
  ChimpScanState<float>::ChimpScanState(in_stack_fffffffffffed7c0,in_stack_fffffffffffed7b8);
  this = (ChimpGroupState<unsigned_int> *)UnsafeNumericCast<unsigned_long,long,void>(in_RDX);
  ChimpScanState<float>::Skip
            (in_stack_fffffffffffee730,in_stack_fffffffffffee728,in_stack_fffffffffffee720);
  this_00 = (ChimpScanState<float> *)FlatVector::GetData<unsigned_int>((Vector *)0x9e98a5);
  bVar1 = ChimpScanState<float>::GroupFinished((ChimpScanState<float> *)&stack0xfffffffffffed740);
  if ((bVar1) && (uStack_12898 < local_30)) {
    ChimpScanState<float>::LoadGroup
              ((ChimpScanState<float> *)in_stack_fffffffffffed750._M_pi,
               (CHIMP_TYPE *)in_stack_fffffffffffed748);
  }
  ChimpGroupState<unsigned_int>::Scan(this,in_RDI,(idx_t)this_00);
  ChimpScanState<float>::~ChimpScanState(this_00);
  return;
}

Assistant:

void ChimpFetchRow(ColumnSegment &segment, ColumnFetchState &state, row_t row_id, Vector &result, idx_t result_idx) {
	using INTERNAL_TYPE = typename ChimpType<T>::TYPE;

	ChimpScanState<T> scan_state(segment);
	scan_state.Skip(segment, UnsafeNumericCast<idx_t>(row_id));
	auto result_data = FlatVector::GetData<INTERNAL_TYPE>(result);

	if (scan_state.GroupFinished() && scan_state.total_value_count < scan_state.segment_count) {
		scan_state.LoadGroup(scan_state.group_state.values);
	}
	scan_state.group_state.Scan(&result_data[result_idx], 1);

	scan_state.total_value_count++;
}